

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_context.c
# Opt level: O1

int test_contexts_digest_or_legacy_mac(EVP_MD *type,int mac)

{
  int iVar1;
  int iVar2;
  EVP_MD_CTX *ctx;
  EVP_MD_CTX *out;
  char *__s;
  long lVar3;
  EVP_MD_CTX *in;
  char *__s_00;
  uint tmplen;
  uchar c [64];
  uchar b [64];
  uchar K [32];
  uchar pt [256];
  uint local_1cc;
  uchar local_1c8 [64];
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 local_128 [256];
  
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 1;
  uStack_140 = 0;
  memset(local_128,0,0x100);
  local_128[0] = 1;
  local_158 = 0;
  uStack_150 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_188 = 0;
  uStack_180 = 0;
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  if (ctx == (EVP_MD_CTX *)0x0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("ctx = EVP_MD_CTX_new()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0xae);
  }
  iVar1 = EVP_DigestInit_ex(ctx,(EVP_MD *)type,(ENGINE *)0x0);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_DigestInit_ex(ctx, type, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0xaf);
  }
  if (mac != 0) {
    iVar1 = EVP_MD_CTX_ctrl(ctx,0x1004,0x20,&local_148);
    if (iVar1 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_MD_CTX_ctrl(ctx, EVP_MD_CTRL_SET_KEY, sizeof(K), (void *)K)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                  ,0xb1);
    }
  }
  iVar1 = EVP_DigestUpdate(ctx,local_128,0x100);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_DigestUpdate(ctx, pt, sizeof(pt))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0xb2);
  }
  iVar1 = EVP_DigestFinal_ex(ctx,(uchar *)&local_188,&local_1cc);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_DigestFinal_ex(ctx, b, &tmplen)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0xb3);
  }
  EVP_MD_CTX_reset(ctx);
  EVP_MD_CTX_reset(ctx);
  iVar1 = EVP_DigestInit_ex(ctx,(EVP_MD *)type,(ENGINE *)0x0);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_DigestInit_ex(ctx, type, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0xb9);
  }
  if (mac != 0) {
    iVar1 = EVP_MD_CTX_ctrl(ctx,0x1004,0x20,&local_148);
    if (iVar1 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_MD_CTX_ctrl(ctx, EVP_MD_CTRL_SET_KEY, sizeof(K), (void *)K)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                  ,0xbb);
    }
  }
  lVar3 = 0;
  printf(" cloned contexts: ");
  local_1c8[0] = '\0';
  local_1c8[1] = '\0';
  local_1c8[2] = '\0';
  local_1c8[3] = '\0';
  local_1c8[4] = '\0';
  local_1c8[5] = '\0';
  local_1c8[6] = '\0';
  local_1c8[7] = '\0';
  local_1c8[8] = '\0';
  local_1c8[9] = '\0';
  local_1c8[10] = '\0';
  local_1c8[0xb] = '\0';
  local_1c8[0xc] = '\0';
  local_1c8[0xd] = '\0';
  local_1c8[0xe] = '\0';
  local_1c8[0xf] = '\0';
  local_1c8[0x10] = '\0';
  local_1c8[0x11] = '\0';
  local_1c8[0x12] = '\0';
  local_1c8[0x13] = '\0';
  local_1c8[0x14] = '\0';
  local_1c8[0x15] = '\0';
  local_1c8[0x16] = '\0';
  local_1c8[0x17] = '\0';
  local_1c8[0x18] = '\0';
  local_1c8[0x19] = '\0';
  local_1c8[0x1a] = '\0';
  local_1c8[0x1b] = '\0';
  local_1c8[0x1c] = '\0';
  local_1c8[0x1d] = '\0';
  local_1c8[0x1e] = '\0';
  local_1c8[0x1f] = '\0';
  local_1c8[0x20] = '\0';
  local_1c8[0x21] = '\0';
  local_1c8[0x22] = '\0';
  local_1c8[0x23] = '\0';
  local_1c8[0x24] = '\0';
  local_1c8[0x25] = '\0';
  local_1c8[0x26] = '\0';
  local_1c8[0x27] = '\0';
  local_1c8[0x28] = '\0';
  local_1c8[0x29] = '\0';
  local_1c8[0x2a] = '\0';
  local_1c8[0x2b] = '\0';
  local_1c8[0x2c] = '\0';
  local_1c8[0x2d] = '\0';
  local_1c8[0x2e] = '\0';
  local_1c8[0x2f] = '\0';
  local_1c8[0x30] = '\0';
  local_1c8[0x31] = '\0';
  local_1c8[0x32] = '\0';
  local_1c8[0x33] = '\0';
  local_1c8[0x34] = '\0';
  local_1c8[0x35] = '\0';
  local_1c8[0x36] = '\0';
  local_1c8[0x37] = '\0';
  local_1c8[0x38] = '\0';
  local_1c8[0x39] = '\0';
  local_1c8[0x3a] = '\0';
  local_1c8[0x3b] = '\0';
  local_1c8[0x3c] = '\0';
  local_1c8[0x3d] = '\0';
  local_1c8[0x3e] = '\0';
  local_1c8[0x3f] = '\0';
  in = ctx;
  do {
    out = (EVP_MD_CTX *)EVP_MD_CTX_new();
    if (out == (EVP_MD_CTX *)0x0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("copy = EVP_MD_CTX_new()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                  ,0xc2);
    }
    iVar1 = EVP_MD_CTX_copy_ex(out,in);
    if (iVar1 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_MD_CTX_copy_ex(copy, ctx)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                  ,0xc3);
    }
    if (ctx != in) {
      EVP_MD_CTX_free(in);
    }
    iVar1 = EVP_DigestUpdate(out,local_128 + lVar3,0x10);
    if (iVar1 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_DigestUpdate(ctx, pt + STEP_SIZE * i, STEP_SIZE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                  ,0xca);
    }
    lVar3 = lVar3 + 0x10;
    in = out;
  } while (lVar3 != 0x100);
  iVar1 = EVP_DigestFinal_ex(out,local_1c8,&local_1cc);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_DigestFinal_ex(ctx, c, &tmplen)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0xcd);
  }
  iVar1 = bcmp(local_1c8,&local_188,0x40);
  __s_00 = "\x1b[1;31m  Test FAILED\x1b[m";
  __s = "\x1b[1;31m  Test FAILED\x1b[m";
  if (iVar1 == 0) {
    __s = "\x1b[1;32m  Test passed\x1b[m";
  }
  puts(__s);
  EVP_MD_CTX_free(out);
  if (iVar1 != 0) {
    printf("  b[%d] = ",0x100);
    hexdump(&local_188,0x100);
    printf("  c[%d] = ",0x100);
    hexdump(local_1c8,0x100);
  }
  printf("    base context: ");
  local_1c8[0] = '\0';
  local_1c8[1] = '\0';
  local_1c8[2] = '\0';
  local_1c8[3] = '\0';
  local_1c8[4] = '\0';
  local_1c8[5] = '\0';
  local_1c8[6] = '\0';
  local_1c8[7] = '\0';
  local_1c8[8] = '\0';
  local_1c8[9] = '\0';
  local_1c8[10] = '\0';
  local_1c8[0xb] = '\0';
  local_1c8[0xc] = '\0';
  local_1c8[0xd] = '\0';
  local_1c8[0xe] = '\0';
  local_1c8[0xf] = '\0';
  local_1c8[0x10] = '\0';
  local_1c8[0x11] = '\0';
  local_1c8[0x12] = '\0';
  local_1c8[0x13] = '\0';
  local_1c8[0x14] = '\0';
  local_1c8[0x15] = '\0';
  local_1c8[0x16] = '\0';
  local_1c8[0x17] = '\0';
  local_1c8[0x18] = '\0';
  local_1c8[0x19] = '\0';
  local_1c8[0x1a] = '\0';
  local_1c8[0x1b] = '\0';
  local_1c8[0x1c] = '\0';
  local_1c8[0x1d] = '\0';
  local_1c8[0x1e] = '\0';
  local_1c8[0x1f] = '\0';
  local_1c8[0x20] = '\0';
  local_1c8[0x21] = '\0';
  local_1c8[0x22] = '\0';
  local_1c8[0x23] = '\0';
  local_1c8[0x24] = '\0';
  local_1c8[0x25] = '\0';
  local_1c8[0x26] = '\0';
  local_1c8[0x27] = '\0';
  local_1c8[0x28] = '\0';
  local_1c8[0x29] = '\0';
  local_1c8[0x2a] = '\0';
  local_1c8[0x2b] = '\0';
  local_1c8[0x2c] = '\0';
  local_1c8[0x2d] = '\0';
  local_1c8[0x2e] = '\0';
  local_1c8[0x2f] = '\0';
  local_1c8[0x30] = '\0';
  local_1c8[0x31] = '\0';
  local_1c8[0x32] = '\0';
  local_1c8[0x33] = '\0';
  local_1c8[0x34] = '\0';
  local_1c8[0x35] = '\0';
  local_1c8[0x36] = '\0';
  local_1c8[0x37] = '\0';
  local_1c8[0x38] = '\0';
  local_1c8[0x39] = '\0';
  local_1c8[0x3a] = '\0';
  local_1c8[0x3b] = '\0';
  local_1c8[0x3c] = '\0';
  local_1c8[0x3d] = '\0';
  local_1c8[0x3e] = '\0';
  local_1c8[0x3f] = '\0';
  iVar2 = EVP_DigestUpdate(ctx,local_128,0x100);
  if (iVar2 != 0) {
    iVar2 = EVP_DigestFinal_ex(ctx,local_1c8,&local_1cc);
    if (iVar2 != 0) {
      iVar2 = bcmp(local_1c8,&local_188,0x40);
      if (iVar2 == 0) {
        __s_00 = "\x1b[1;32m  Test passed\x1b[m";
      }
      puts(__s_00);
      EVP_MD_CTX_free(ctx);
      if (iVar2 != 0) {
        printf("  b[%d] = ",0x100);
        hexdump(&local_188,0x100);
        printf("  c[%d] = ",0x100);
        hexdump(local_1c8,0x100);
      }
      return (int)(iVar2 != 0 || iVar1 != 0);
    }
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_DigestFinal_ex(save, c, &tmplen)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0xdd);
  }
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestUpdate(save, pt, sizeof(pt))",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
              ,0xdc);
}

Assistant:

static int test_contexts_digest_or_legacy_mac(const EVP_MD *type, int mac)
{
    int ret = 0, test = 0;
    unsigned char K[32] = {1};

    /* produce base digest */
    EVP_MD_CTX *ctx, *save;
    unsigned char pt[TEST_SIZE] = {1};
    unsigned char b[EVP_MAX_MD_SIZE] = {0};
    unsigned char c[EVP_MAX_MD_SIZE];
    unsigned int outlen, tmplen;

    /* Simply digest whole input. */
    T(ctx = EVP_MD_CTX_new());
    T(EVP_DigestInit_ex(ctx, type, NULL));
    if (mac)
	T(EVP_MD_CTX_ctrl(ctx, EVP_MD_CTRL_SET_KEY, sizeof(K), (void *)K));
    T(EVP_DigestUpdate(ctx, pt, sizeof(pt)));
    T(EVP_DigestFinal_ex(ctx, b, &tmplen));
    save = ctx; /* will be not freed while cloning */

    /* cloned digest */
    EVP_MD_CTX_reset(ctx); /* test double reset */
    EVP_MD_CTX_reset(ctx);
    T(EVP_DigestInit_ex(ctx, type, NULL));
    if (mac)
	T(EVP_MD_CTX_ctrl(ctx, EVP_MD_CTRL_SET_KEY, sizeof(K), (void *)K));
    printf(" cloned contexts: ");
    memset(c, 0, sizeof(c));
    int i;
    for (i = 0; i < TEST_SIZE / STEP_SIZE; i++) {
	/* Clone and continue digesting next part of input. */
	EVP_MD_CTX *copy;
	T(copy = EVP_MD_CTX_new());
	T(EVP_MD_CTX_copy_ex(copy, ctx));

	/* rolling */
	if (save != ctx)
	    EVP_MD_CTX_free(ctx);
	ctx = copy;

	T(EVP_DigestUpdate(ctx, pt + STEP_SIZE * i, STEP_SIZE));
    }
    outlen = i * STEP_SIZE;
    T(EVP_DigestFinal_ex(ctx, c, &tmplen));
    /* Should be same as the simple digest. */
    TEST_ASSERT(outlen != TEST_SIZE || memcmp(c, b, EVP_MAX_MD_SIZE));
    EVP_MD_CTX_free(ctx);
    if (test) {
	printf("  b[%d] = ", outlen);
	hexdump(b, outlen);
	printf("  c[%d] = ", outlen);
	hexdump(c, outlen);
    }
    ret |= test;

    /* Resume original context, what if it's damaged? */
    printf("    base context: ");
    memset(c, 0, sizeof(c));
    T(EVP_DigestUpdate(save, pt, sizeof(pt)));
    T(EVP_DigestFinal_ex(save, c, &tmplen));
    TEST_ASSERT(outlen != TEST_SIZE || memcmp(c, b, EVP_MAX_MD_SIZE));
    EVP_MD_CTX_free(save);
    if (test) {
	printf("  b[%d] = ", outlen);
	hexdump(b, outlen);
	printf("  c[%d] = ", outlen);
	hexdump(c, outlen);
    }
    ret |= test;

    return ret;
}